

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Utf16ByteLen(void *zIn,int nChar)

{
  byte *pbVar1;
  int local_24;
  byte *pbStack_20;
  int n;
  uchar *z;
  int c;
  int nChar_local;
  void *zIn_local;
  
  pbStack_20 = (byte *)((long)zIn + 1);
  for (local_24 = 0; local_24 < nChar; local_24 = local_24 + 1) {
    pbVar1 = pbStack_20 + 2;
    if ((((0xd7 < *pbStack_20) && (*pbStack_20 < 0xdc)) && (0xdb < *pbVar1)) && (*pbVar1 < 0xe0)) {
      pbVar1 = pbStack_20 + 4;
    }
    pbStack_20 = pbVar1;
  }
  return ((int)pbStack_20 - (int)zIn) + -1;
}

Assistant:

SQLITE_PRIVATE int sqlite3Utf16ByteLen(const void *zIn, int nChar){
  int c;
  unsigned char const *z = zIn;
  int n = 0;

  if( SQLITE_UTF16NATIVE==SQLITE_UTF16LE ) z++;
  while( n<nChar ){
    c = z[0];
    z += 2;
    if( c>=0xd8 && c<0xdc && z[0]>=0xdc && z[0]<0xe0 ) z += 2;
    n++;
  }
  return (int)(z-(unsigned char const *)zIn)
              - (SQLITE_UTF16NATIVE==SQLITE_UTF16LE);
}